

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SplitLargeMeshes.cpp
# Opt level: O3

void Assimp::SplitLargeMeshesProcess_Triangle::UpdateNode
               (aiNode *pcNode,
               vector<std::pair<aiMesh_*,_unsigned_int>,_std::allocator<std::pair<aiMesh_*,_unsigned_int>_>_>
               *avList)

{
  pointer ppVar1;
  uint *puVar2;
  pointer ppVar3;
  ulong uVar4;
  ulong uVar5;
  uint uVar6;
  bool bVar7;
  vector<unsigned_int,_std::allocator<unsigned_int>_> aiEntries;
  uint local_4c;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_48;
  
  local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (uint *)0x0;
  local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (uint *)0x0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve
            (&local_48,(ulong)(pcNode->mNumMeshes + 1));
  uVar6 = pcNode->mNumMeshes;
  if (uVar6 != 0) {
    ppVar1 = (avList->
             super__Vector_base<std::pair<aiMesh_*,_unsigned_int>,_std::allocator<std::pair<aiMesh_*,_unsigned_int>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    ppVar3 = (avList->
             super__Vector_base<std::pair<aiMesh_*,_unsigned_int>,_std::allocator<std::pair<aiMesh_*,_unsigned_int>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    uVar5 = 0;
    do {
      local_4c = 0;
      bVar7 = ppVar3 != ppVar1;
      ppVar3 = ppVar1;
      if (bVar7) {
        uVar4 = 0;
        do {
          if (ppVar1[uVar4].second == pcNode->mMeshes[uVar5]) {
            if (local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish ==
                local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<unsigned_int,std::allocator<unsigned_int>>::
              _M_realloc_insert<unsigned_int_const&>
                        ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_48,
                         (iterator)
                         local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_finish,&local_4c);
            }
            else {
              *local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish = local_4c;
              local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_finish + 1;
            }
          }
          local_4c = local_4c + 1;
          uVar4 = (ulong)local_4c;
          ppVar1 = (avList->
                   super__Vector_base<std::pair<aiMesh_*,_unsigned_int>,_std::allocator<std::pair<aiMesh_*,_unsigned_int>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          ppVar3 = (avList->
                   super__Vector_base<std::pair<aiMesh_*,_unsigned_int>,_std::allocator<std::pair<aiMesh_*,_unsigned_int>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
        } while (uVar4 < (ulong)((long)ppVar3 - (long)ppVar1 >> 4));
        uVar6 = pcNode->mNumMeshes;
      }
      uVar5 = uVar5 + 1;
    } while (uVar5 < uVar6);
  }
  if (pcNode->mMeshes != (uint *)0x0) {
    operator_delete__(pcNode->mMeshes);
  }
  uVar6 = (uint)((ulong)((long)local_48.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_finish -
                        (long)local_48.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start) >> 2);
  pcNode->mNumMeshes = uVar6;
  puVar2 = (uint *)operator_new__((long)local_48.
                                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)local_48.
                                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                        ._M_impl.super__Vector_impl_data._M_start & 0x3fffffffc);
  pcNode->mMeshes = puVar2;
  if (uVar6 != 0) {
    uVar5 = 0;
    do {
      pcNode->mMeshes[uVar5] =
           local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start[uVar5];
      uVar5 = uVar5 + 1;
    } while (uVar5 < pcNode->mNumMeshes);
  }
  if (pcNode->mNumChildren != 0) {
    uVar5 = 0;
    do {
      UpdateNode(pcNode->mChildren[uVar5],avList);
      uVar5 = uVar5 + 1;
    } while (uVar5 < pcNode->mNumChildren);
  }
  if (local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void SplitLargeMeshesProcess_Triangle::UpdateNode(aiNode* pcNode,
        const std::vector<std::pair<aiMesh*, unsigned int> >& avList) {
    // for every index in out list build a new entry
    std::vector<unsigned int> aiEntries;
    aiEntries.reserve(pcNode->mNumMeshes + 1);
    for (unsigned int i = 0; i < pcNode->mNumMeshes;++i) {
        for (unsigned int a = 0; a < avList.size();++a) {
            if (avList[a].second == pcNode->mMeshes[i]) {
                aiEntries.push_back(a);
            }
        }
    }

    // now build the new list
    delete[] pcNode->mMeshes;
    pcNode->mNumMeshes = (unsigned int)aiEntries.size();
    pcNode->mMeshes = new unsigned int[pcNode->mNumMeshes];

    for (unsigned int b = 0; b < pcNode->mNumMeshes;++b) {
        pcNode->mMeshes[b] = aiEntries[b];
    }

    // recusively update all other nodes
    for (unsigned int i = 0; i < pcNode->mNumChildren;++i) {
        UpdateNode ( pcNode->mChildren[i], avList );
    }
}